

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_valid_no_geom_tri(REF_GRID ref_grid,REF_INT node,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  REF_BOOL valid;
  REF_INT nodes [27];
  int local_ac;
  REF_INT local_a8 [30];
  
  if (ref_grid->twod != 0) {
    ref_node = ref_grid->node;
    *allowed = 0;
    if (-1 < node) {
      ref_cell = ref_grid->cell[3];
      pRVar1 = ref_cell->ref_adj;
      if ((node < pRVar1->nnode) && (lVar6 = (long)pRVar1->first[(uint)node], lVar6 != -1)) {
        uVar3 = ref_cell_nodes(ref_cell,pRVar1->item[lVar6].ref,local_a8);
        if (uVar3 == 0) {
          do {
            uVar3 = ref_node_tri_twod_orientation(ref_node,local_a8,&local_ac);
            if (uVar3 != 0) {
              pcVar5 = "valid";
              uVar4 = 0x109;
              goto LAB_001f8d6b;
            }
            if (local_ac == 0) {
              return 0;
            }
            pRVar2 = ref_cell->ref_adj->item;
            lVar6 = (long)pRVar2[(int)lVar6].next;
            if (lVar6 == -1) goto LAB_001f8dc2;
            uVar3 = ref_cell_nodes(ref_cell,pRVar2[lVar6].ref,local_a8);
          } while (uVar3 == 0);
        }
        pcVar5 = "nodes";
        uVar4 = 0x108;
LAB_001f8d6b:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               uVar4,"ref_smooth_valid_no_geom_tri",(ulong)uVar3,pcVar5);
        return uVar3;
      }
    }
  }
LAB_001f8dc2:
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_valid_no_geom_tri(REF_GRID ref_grid,
                                                       REF_INT node,
                                                       REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL valid;

  if (!ref_grid_twod(ref_grid)) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}